

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O0

w_status wp_token_scan_flt_exponent(w_tokenizer *tokenizer,w_token_id *id,w_token_id id_on_success)

{
  int iVar1;
  w_token_id id_on_success_local;
  w_token_id *id_local;
  w_tokenizer *tokenizer_local;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x185);
  }
  if (tokenizer->it == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x186);
  }
  if ((tokenizer->it[-1] != 'e') && (tokenizer->it[-1] != 'p')) {
    w_handle_failed_assertion
              ("tokenizer->it[-1] == \'e\' || tokenizer->it[-1] == \'p\'",
               "wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x187);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x188);
  }
  if ((*tokenizer->it == '+') || (*tokenizer->it == '-')) {
    wp_token_advance_iter(tokenizer);
  }
  iVar1 = (int)*tokenizer->it;
  if ((((*tokenizer->it == '\0') || (iVar1 == 10)) || (iVar1 == 0x20)) ||
     (((iVar1 - 0x2aU < 2 || (iVar1 == 0x2d)) || (iVar1 == 0x2f)))) {
    tokenizer_local._4_4_ = wp_token_add_error(tokenizer,"unterminated floating-point exponent");
  }
  else if (iVar1 - 0x30U < 10) {
    wp_token_consume_decimal_digits(tokenizer);
    iVar1 = (int)*tokenizer->it;
    if (((*tokenizer->it == '\0') || (iVar1 == 10)) ||
       ((iVar1 == 0x20 || (((iVar1 - 0x2aU < 2 || (iVar1 == 0x2d)) || (iVar1 == 0x2f)))))) {
      *id = id_on_success;
      tokenizer_local._4_4_ = W_SUCCESS;
    }
    else {
      tokenizer_local._4_4_ =
           wp_token_add_error(tokenizer,"not a valid floating-point exponent character");
    }
  }
  else {
    tokenizer_local._4_4_ =
         wp_token_add_error(tokenizer,"not a valid floating-point exponent character");
  }
  return tokenizer_local._4_4_;
}

Assistant:

static enum w_status
wp_token_scan_flt_exponent(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id,
    enum w_token_id id_on_success
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(tokenizer->it[-1] == 'e' || tokenizer->it[-1] == 'p');
    W_ASSERT(id != NULL);

    if (*tokenizer->it == '+' || *tokenizer->it == '-')
    {
        wp_token_advance_iter(tokenizer);
    }

    switch (*tokenizer->it)
    {
        case WP_TOKEN_CASE_DECIMAL_DIGITS:
        {
            wp_token_consume_decimal_digits(tokenizer);
            switch (*tokenizer->it)
            {
                case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
                {
                    *id = id_on_success;
                    return W_SUCCESS;
                }
                default:
                {
                    return wp_token_add_error(
                        tokenizer,
                        WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                            "floating-point exponent"
                        )
                    );
                }
            }
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_UNTERMINATED("floating-point exponent")
            );
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR("floating-point exponent")
            );
        }
    }
}